

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

vector<crnlib::dynamic_string> * __thiscall
crnlib::vector<crnlib::dynamic_string>::operator=
          (vector<crnlib::dynamic_string> *this,vector<crnlib::dynamic_string> *other)

{
  uint local_34;
  dynamic_string *pdStack_30;
  uint i;
  dynamic_string *pSrc;
  dynamic_string *pDst;
  vector<crnlib::dynamic_string> *other_local;
  vector<crnlib::dynamic_string> *this_local;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      increase_capacity(this,other->m_size,false,false);
    }
    else {
      resize(this,0,false);
    }
    pdStack_30 = other->m_p;
    pSrc = this->m_p;
    for (local_34 = other->m_size; local_34 != 0; local_34 = local_34 - 1) {
      helpers::construct<crnlib::dynamic_string,crnlib::dynamic_string>(pSrc,pdStack_30);
      pdStack_30 = pdStack_30 + 1;
      pSrc = pSrc + 1;
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }